

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigSat.c
# Opt level: O0

void Fraig_DetectFanoutFreeConeMux_rec
               (Fraig_Node_t *pNode,Fraig_NodeVec_t *vSuper,Fraig_NodeVec_t *vInside,int fFirst)

{
  int iVar1;
  Fraig_Node_t *p;
  int fFirst_local;
  Fraig_NodeVec_t *vInside_local;
  Fraig_NodeVec_t *vSuper_local;
  Fraig_Node_t *pNode_local;
  
  p = (Fraig_Node_t *)((ulong)pNode & 0xfffffffffffffffe);
  if ((((fFirst != 0) || (p->nRefs < 2)) && (iVar1 = Fraig_NodeIsVar(p), iVar1 == 0)) &&
     (iVar1 = Fraig_NodeIsMuxType(p), iVar1 != 0)) {
    Fraig_DetectFanoutFreeConeMux_rec
              (*(Fraig_Node_t **)(((ulong)p->p1 & 0xfffffffffffffffe) + 0x20),vSuper,vInside,0);
    Fraig_DetectFanoutFreeConeMux_rec
              (*(Fraig_Node_t **)(((ulong)p->p1 & 0xfffffffffffffffe) + 0x28),vSuper,vInside,0);
    Fraig_DetectFanoutFreeConeMux_rec
              (*(Fraig_Node_t **)(((ulong)p->p2 & 0xfffffffffffffffe) + 0x20),vSuper,vInside,0);
    Fraig_DetectFanoutFreeConeMux_rec
              (*(Fraig_Node_t **)(((ulong)p->p2 & 0xfffffffffffffffe) + 0x28),vSuper,vInside,0);
    Fraig_NodeVecPushUnique(vInside,p);
    return;
  }
  Fraig_NodeVecPushUnique(vSuper,p);
  return;
}

Assistant:

void Fraig_DetectFanoutFreeConeMux_rec( Fraig_Node_t * pNode, Fraig_NodeVec_t * vSuper, Fraig_NodeVec_t * vInside, int fFirst )
{
    // make the pointer regular
    pNode = Fraig_Regular(pNode);
    // if the new node is complemented or a PI, another gate begins
    if ( (!fFirst && pNode->nRefs > 1) || Fraig_NodeIsVar(pNode) || !Fraig_NodeIsMuxType(pNode) )
    {
        Fraig_NodeVecPushUnique( vSuper, pNode );
        return;
    }
    // go through the branches
    Fraig_DetectFanoutFreeConeMux_rec( Fraig_Regular(pNode->p1)->p1, vSuper, vInside, 0 );
    Fraig_DetectFanoutFreeConeMux_rec( Fraig_Regular(pNode->p1)->p2, vSuper, vInside, 0 );
    Fraig_DetectFanoutFreeConeMux_rec( Fraig_Regular(pNode->p2)->p1, vSuper, vInside, 0 );
    Fraig_DetectFanoutFreeConeMux_rec( Fraig_Regular(pNode->p2)->p2, vSuper, vInside, 0 );
    // add the node
    Fraig_NodeVecPushUnique( vInside, pNode );
}